

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O0

Type * __thiscall
slang::ast::SimpleSystemSubroutine::checkArguments
          (SimpleSystemSubroutine *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  undefined8 in_RCX;
  ASTContext *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  Compilation *comp;
  ASTContext *context_00;
  Expression *expr;
  Args *args_00;
  undefined1 isMethod;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RCX >> 0x38);
  args_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0xa40d49);
  expr = (Expression *)in_RDI[5]._M_extent._M_extent_value;
  context_00 = in_RDX;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::size
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &in_RDI[3]._M_extent);
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,(bool)isMethod,args_00,in_stack_00000000,
                     in_stack_00000020,in_stack_00000028);
  if (bVar1) {
    if ((((ulong)in_RDI[6]._M_ptr & 0x100) != 0) &&
       (bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           0xa40df7), !bVar1)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
      bVar1 = SystemSubroutine::registerLValue(expr,context_00);
      if (!bVar1) {
        pTVar2 = Compilation::getErrorType(this_00);
        return pTVar2;
      }
    }
    pTVar2 = (Type *)in_RDI[5]._M_ptr;
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& SimpleSystemSubroutine::checkArguments(const ASTContext& context, const Args& args,
                                                   SourceRange range, const Expression*) const {
    auto& comp = context.getCompilation();
    if (!checkArgCount(context, isMethod, args, range, requiredArgs, argTypes.size()))
        return comp.getErrorType();

    if (isFirstArgLValue && !args.empty() && !registerLValue(*args[0], context))
        return comp.getErrorType();

    return *returnType;
}